

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrRecommendedLayerResolutionGetInfoMETA *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  NextChainResult NVar2;
  XrResult XVar3;
  XrStructureType XVar4;
  XrCompositionLayerEquirect2KHR *value_00;
  string error_message;
  string local_1e8;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_178;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_160;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_148;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_130;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_118;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_100;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_d0;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a0;
  string local_88;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  
  XVar3 = XR_SUCCESS;
  if (value->type != XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrRecommendedLayerResolutionGetInfoMETA",
               value->type,"VUID-XrRecommendedLayerResolutionGetInfoMETA-type-type",
               XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META,
               "XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META");
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    NVar2 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs
                              ,&encountered_structs,&duplicate_ext_structs);
    if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,
                 "Multiple structures of the same type(s) in \"next\" chain for ","");
      std::__cxx11::string::append((char *)&error_message);
      StructTypesToString_abi_cxx11_(&local_1e8,instance_info,&duplicate_ext_structs);
      std::__cxx11::string::_M_append((char *)&error_message,(ulong)local_1e8._M_dataplus._M_p);
      paVar1 = &local_1e8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      local_1e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"VUID-XrRecommendedLayerResolutionGetInfoMETA-next-unique","")
      ;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_b8,objects_info);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 "Multiple structures of the same type(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct"
                 ,"");
      CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          &local_b8,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_b8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
LAB_001e05a2:
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
LAB_001e05af:
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"VUID-XrRecommendedLayerResolutionGetInfoMETA-next-next",
                 "");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_a0,objects_info);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "Invalid structure(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct \"next\""
                 ,"");
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,&local_a0,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_a0.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) goto LAB_001e05a2;
      goto LAB_001e05af;
    }
    if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(duplicate_ext_structs.
                      super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)duplicate_ext_structs.
                            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (!check_members || XVar3 != XR_SUCCESS) {
    return XVar3;
  }
  value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
  if (value_00 == (XrCompositionLayerEquirect2KHR *)0x0) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_d0,objects_info);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,
               "XrRecommendedLayerResolutionGetInfoMETA contains invalid NULL for XrCompositionLayerBaseHeader \"layer\" which is not optional and must be non-NULL"
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_d0,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_d0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p == &error_message.field_2) {
      return XR_ERROR_VALIDATION_FAILURE;
    }
    goto LAB_001e0ef6;
  }
  XVar4 = value_00->type;
  if (XVar4 == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
    XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                             (XrCompositionLayerProjection *)value_00);
    if (XVar3 == XR_SUCCESS) {
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar4 = value_00->type;
      goto LAB_001e08dc;
    }
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Structure XrRecommendedLayerResolutionGetInfoMETA member layer","");
    std::__cxx11::string::append((char *)&error_message);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
               "");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_e8,objects_info);
    CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_e8,&error_message);
    local_100.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_100.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
LAB_001e08dc:
    if (XVar4 == XR_TYPE_COMPOSITION_LAYER_QUAD) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerQuad *)value_00);
      if (XVar3 != XR_SUCCESS) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer","");
        std::__cxx11::string::append((char *)&error_message);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_100,objects_info);
        CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_100,&error_message);
        goto joined_r0x001e099b;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar4 = value_00->type;
    }
    if (XVar4 == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerCubeKHR *)value_00);
      if (XVar3 != XR_SUCCESS) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer","");
        std::__cxx11::string::append((char *)&error_message);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_118,objects_info);
        CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_118,&error_message);
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_118.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_118.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        goto joined_r0x001e099b;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar4 = value_00->type;
    }
    if (XVar4 == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerCylinderKHR *)value_00);
      if (XVar3 != XR_SUCCESS) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer","");
        std::__cxx11::string::append((char *)&error_message);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_130,objects_info);
        CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_130,&error_message);
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_130.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_130.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        goto joined_r0x001e099b;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar4 = value_00->type;
    }
    if (XVar4 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerEquirectKHR *)value_00);
      if (XVar3 != XR_SUCCESS) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer","");
        std::__cxx11::string::append((char *)&error_message);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_148,objects_info);
        CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_148,&error_message);
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_148.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_148.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        goto joined_r0x001e099b;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar4 = value_00->type;
    }
    if (XVar4 == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,value_00);
      if (XVar3 != XR_SUCCESS) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer","");
        std::__cxx11::string::append((char *)&error_message);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_160,objects_info);
        CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_160,&error_message);
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_160.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_160.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        goto joined_r0x001e099b;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar4 = value_00->type;
    }
    if (XVar4 == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                               (XrCompositionLayerPassthroughFB *)value_00);
      if (XVar3 != XR_SUCCESS) {
        error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,
                   "Structure XrRecommendedLayerResolutionGetInfoMETA member layer","");
        std::__cxx11::string::append((char *)&error_message);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,
                   "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_178,objects_info);
        CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_178,&error_message);
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_178.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_100.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_178.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        goto joined_r0x001e099b;
      }
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      XVar4 = value_00->type;
    }
    if (XVar4 != XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
LAB_001e0f23:
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,false,
                               (XrCompositionLayerBaseHeader *)value_00);
      if (XVar3 == XR_SUCCESS) {
        return XR_SUCCESS;
      }
      error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,
                 "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1a8,objects_info);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "Structure XrRecommendedLayerResolutionGetInfoMETA member layer is invalid","");
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,&local_1a8,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != &error_message.field_2) {
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
        return XVar3;
      }
      return XVar3;
    }
    XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,true,true,
                             (XrCompositionLayerPassthroughHTC *)value_00);
    if (XVar3 == XR_SUCCESS) {
      value_00 = (XrCompositionLayerEquirect2KHR *)value->layer;
      goto LAB_001e0f23;
    }
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Structure XrRecommendedLayerResolutionGetInfoMETA member layer","");
    std::__cxx11::string::append((char *)&error_message);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
               "");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_190,objects_info);
    CoreValidLogMessage(instance_info,&local_1e8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_190,&error_message);
    local_100.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_190.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_100.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_190.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
joined_r0x001e099b:
  if (local_100.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error_message._M_dataplus._M_p == &error_message.field_2) {
    return XR_ERROR_VALIDATION_FAILURE;
  }
LAB_001e0ef6:
  operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrRecommendedLayerResolutionGetInfoMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrRecommendedLayerResolutionGetInfoMETA",
                             value->type, "VUID-XrRecommendedLayerResolutionGetInfoMETA-type-type", XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META, "XR_TYPE_RECOMMENDED_LAYER_RESOLUTION_GET_INFO_META");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrRecommendedLayerResolutionGetInfoMETA : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrRecommendedLayerResolutionGetInfoMETA struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional pointer/array variable that needs to not be NULL
    if (nullptr == value->layer) {
        CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrRecommendedLayerResolutionGetInfoMETA contains invalid NULL for XrCompositionLayerBaseHeader \"layer\" which is not "
                            "optional and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
    {
        const XrCompositionLayerProjection* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection*>(value->layer);
        if (new_compositionlayerprojection_value->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerprojection_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
    {
        const XrCompositionLayerQuad* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad*>(value->layer);
        if (new_compositionlayerquad_value->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerquad_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
    {
        const XrCompositionLayerCubeKHR* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR*>(value->layer);
        if (new_compositionlayercubekhr_value->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayercubekhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
    {
        const XrCompositionLayerCylinderKHR* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR*>(value->layer);
        if (new_compositionlayercylinderkhr_value->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayercylinderkhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
    {
        const XrCompositionLayerEquirectKHR* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR*>(value->layer);
        if (new_compositionlayerequirectkhr_value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerequirectkhr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
    {
        const XrCompositionLayerEquirect2KHR* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR*>(value->layer);
        if (new_compositionlayerequirect2khr_value->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerequirect2khr_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
    {
        const XrCompositionLayerPassthroughFB* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB*>(value->layer);
        if (new_compositionlayerpassthroughfb_value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerpassthroughfb_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
    {
        const XrCompositionLayerPassthroughHTC* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC*>(value->layer);
        if (new_compositionlayerpassthroughhtc_value->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
            xr_result = ValidateXrStruct(instance_info, command_name,
                                                            objects_info, check_members, true, new_compositionlayerpassthroughhtc_value);
            if (XR_SUCCESS != xr_result) {
                std::string error_message = "Structure XrRecommendedLayerResolutionGetInfoMETA member layer";
                error_message += " is invalid";
                CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Validate that the base-structure XrCompositionLayerBaseHeader is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, value->layer);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrRecommendedLayerResolutionGetInfoMETA-layer-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrRecommendedLayerResolutionGetInfoMETA member layer is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}